

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpPrepass::OnNameEntry
          (BinaryReaderObjdumpPrepass *this,NameSectionSubsection type,Index index,string_view name)

{
  uint uVar1;
  
  uVar1 = type - Type;
  if ((uVar1 < 7) && ((0x6bU >> (uVar1 & 0x1f) & 1) != 0)) {
    ObjdumpNames::Set((ObjdumpNames *)
                      ((long)&(((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                              code_relocations).
                              super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                              super__Vector_impl_data._M_start +
                      *(long *)(&DAT_0012a470 + (ulong)uVar1 * 8)),index,name);
  }
  return (Result)Ok;
}

Assistant:

Result OnNameEntry(NameSectionSubsection type,
                     Index index,
                     std::string_view name) override {
    switch (type) {
      // TODO(sbc): remove OnFunctionName in favor of just using
      // OnNameEntry so that this works
      /*
      case NameSectionSubsection::Function:
        SetFunctionName(index, name);
        break;
      */
      case NameSectionSubsection::Type:
        SetTypeName(index, name);
        break;
      case NameSectionSubsection::Global:
        SetGlobalName(index, name);
        break;
      case NameSectionSubsection::Table:
        SetTableName(index, name);
        break;
      case NameSectionSubsection::DataSegment:
        SetSegmentName(index, name);
        break;
      case NameSectionSubsection::Tag:
        SetTagName(index, name);
        break;
      default:
        break;
    }
    return Result::Ok;
  }